

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O2

FluxData *
KryoFlux::DecodeStream
          (FluxData *__return_storage_ptr__,Data *data,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *warnings)

{
  byte bVar1;
  uint *puVar2;
  pointer puVar3;
  pointer pbVar4;
  ulong uVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  pointer puVar12;
  uint *puVar13;
  pointer pbVar14;
  uint *puVar15;
  ulong uVar16;
  int local_154;
  uint32_t *pdw;
  int local_144;
  int local_134;
  string info;
  string name;
  vector<unsigned_int,_std::allocator<unsigned_int>_> flux_counts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> flux_times;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index_offsets;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&flux_times,
             (long)(*(int *)&(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                   *(int *)&(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&flux_counts,
             (long)(*(int *)&(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                   *(int *)&(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start));
  index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar15 = (uint *)(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  puVar2 = (uint *)(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  local_144 = 0xa293;
  local_134 = 0;
  uVar11 = 0;
  local_154 = 0;
LAB_0016c093:
  puVar3 = index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar13 = puVar15;
LAB_0016c0ac:
  if (puVar13 == puVar2) {
    uVar11 = 0;
    puVar12 = index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    goto LAB_0016c500;
  }
  flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[uVar11] =
       (uint)((ulong)((long)flux_times.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)flux_times.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
  puVar15 = (uint *)((long)puVar13 + 1);
  bVar1 = (byte)*puVar13;
  switch(bVar1) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    goto switchD_0016c0d5_caseD_0;
  case 8:
    goto switchD_0016c0d5_caseD_8;
  case 9:
    lVar9 = 1;
    break;
  case 10:
    uVar11 = uVar11 + 1;
    lVar9 = 2;
    break;
  case 0xb:
    local_154 = local_154 + 0x10000;
    uVar11 = uVar11 + 1;
    goto LAB_0016c093;
  case 0xc:
    bVar1 = *(byte *)((long)puVar13 + 1);
    puVar15 = (uint *)((long)puVar13 + 2);
    uVar11 = uVar11 + 1;
    goto switchD_0016c0d5_caseD_0;
  case 0xd:
    uVar7 = *(ushort *)((long)puVar13 + 2);
    if (0xd < *(byte *)((long)puVar13 + 1)) {
switchD_0016c175_caseD_5:
      util::fmt_abi_cxx11_(&info,"unexpected OOB sub-type (%X)");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)warnings,&info
                );
LAB_0016c245:
      std::__cxx11::string::~string((string *)&info);
      puVar15 = puVar2;
      goto LAB_0016c4d3;
    }
    puVar15 = puVar13 + 1;
    switch(*(byte *)((long)puVar13 + 1)) {
    case 0:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&info,"invalid OOB detected",(allocator<char> *)&name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)warnings,&info
                );
      goto LAB_0016c245;
    case 1:
      bVar6 = uVar7 != 8;
      uVar7 = 8;
      if (bVar6) {
        __assert_fail("size == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                      ,0x10d,
                      "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                     );
      }
      goto LAB_0016c4d3;
    case 2:
      if (uVar7 != 0xc) {
        __assert_fail("size == 12",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                      ,0x112,
                      "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                     );
      }
      if ((opt.hardsectors < 2) || (local_134 = local_134 + 1, local_134 % opt.hardsectors == 0)) {
        info._M_dataplus._M_p._0_4_ = *puVar15;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&index_offsets,(uint *)&info);
        uVar7 = 0xc;
      }
      else {
        uVar7 = 0xc;
      }
      goto LAB_0016c4d3;
    case 3:
      if (uVar7 != 8) {
        __assert_fail("size == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                      ,0x120,
                      "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                     );
      }
      uVar10 = puVar13[2];
      if (uVar10 != 0) {
        if (uVar10 == 2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&info,"stream end (no index detected)",(allocator<char> *)&name);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)warnings,
                     &info);
        }
        else if (uVar10 == 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&info,"stream end (buffering problem)",(allocator<char> *)&name);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)warnings,
                     &info);
        }
        else {
          util::fmt_abi_cxx11_(&info,"stream end problem (%u)");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)warnings,
                     &info);
        }
        std::__cxx11::string::~string((string *)&info);
      }
      uVar7 = 8;
      goto LAB_0016c4d3;
    case 4:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&info,(char *)puVar15,(allocator<char> *)&name);
      util::split(&local_68,&info,',',false);
      pbVar4 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar4;
          pbVar14 = pbVar14 + 1) {
        lVar9 = std::__cxx11::string::find((char)pbVar14,0x3d);
        if (lVar9 != -1) {
          std::__cxx11::string::substr((ulong)&value,(ulong)pbVar14);
          util::trim(&name,&value);
          std::__cxx11::string::~string((string *)&value);
          std::__cxx11::string::substr((ulong)&local_50,(ulong)pbVar14);
          util::trim(&value,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (((name._M_string_length != 0) && (value._M_string_length != 0)) &&
             (bVar6 = std::operator==(&name,"sck"), bVar6)) {
            iVar8 = atoi(value._M_dataplus._M_p);
            local_144 = (int)(1000000000 / (long)(iVar8 / 1000));
          }
          std::__cxx11::string::~string((string *)&value);
          std::__cxx11::string::~string((string *)&name);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      std::__cxx11::string::~string((string *)&info);
LAB_0016c4d3:
      puVar15 = (uint *)((ulong)uVar7 + (long)puVar15);
      break;
    default:
      goto switchD_0016c175_caseD_5;
    case 0xd:
      if (uVar7 != 0xd0d) {
        __assert_fail("size == 0x0d0d",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                      ,0x147,
                      "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                     );
      }
      uVar7 = 0;
      puVar15 = puVar2;
      goto LAB_0016c4d3;
    }
    goto LAB_0016c093;
  default:
    info._M_dataplus._M_p._0_4_ = ((local_154 + (uint)bVar1) * local_144) / 1000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&flux_times,(uint *)&info);
    uVar11 = uVar11 + 1;
    goto LAB_0016c13a;
  }
  puVar15 = (uint *)((long)puVar13 + lVar9 + 1);
  uVar11 = uVar11 + 1;
switchD_0016c0d5_caseD_8:
  uVar11 = uVar11 + 1;
  puVar13 = puVar15;
  goto LAB_0016c0ac;
LAB_0016c500:
  if (puVar12 == puVar3) {
    if ((__return_storage_ptr__->
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (__return_storage_ptr__->
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&info,"no flux data",(allocator<char> *)&name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)warnings,&info
                );
      std::__cxx11::string::~string((string *)&info);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return __return_storage_ptr__;
  }
  uVar16 = (ulong)*puVar12;
  uVar5 = uVar16;
  if (uVar11 != 0) {
    do {
      uVar16 = uVar5;
      if ((int)uVar16 == 0) {
        uVar10 = *flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar16 = 0;
        break;
      }
      uVar10 = flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16];
      uVar5 = (ulong)((int)uVar16 - 1);
    } while (uVar10 == 0);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&info,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start + uVar11),
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start + uVar10),(allocator_type *)&name);
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)__return_storage_ptr__,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&info);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&info);
  }
  uVar11 = flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar16];
  puVar12 = puVar12 + 1;
  goto LAB_0016c500;
switchD_0016c0d5_caseD_0:
  info._M_dataplus._M_p._0_4_ =
       ((local_154 + (uint)(byte)*puVar15 + (uint)bVar1 * 0x100) * local_144) / 1000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&flux_times,(uint *)&info);
  puVar15 = (uint *)((long)puVar15 + 1);
  uVar11 = uVar11 + 2;
LAB_0016c13a:
  local_154 = 0;
  goto LAB_0016c093;
}

Assistant:

FluxData KryoFlux::DecodeStream(const Data& data, std::vector<std::string>& warnings)
{
    FluxData flux_revs;
    std::vector<uint32_t> flux_times, flux_counts;
    flux_times.reserve(data.size());
    flux_counts.resize(data.size());

    uint32_t time = 0, stream_pos = 0;
    uint32_t ps_per_tick = PS_PER_TICK(SAMPLE_FREQ);
    std::vector<uint32_t> index_offsets;
    int hard_indexes = 0;

    auto itBegin = data.begin(), it = itBegin, itEnd = data.end();
    while (it != itEnd)
    {
        // Store current flux count at each stream position
        flux_counts[stream_pos] = static_cast<int>(flux_times.size());

        auto type = *it++;
        switch (type)
        {
        case 0x0c: // Flux3
            type = *it++;
            stream_pos++;
        case 0x00: case 0x01: case 0x02: case 0x03: // Flux 2
        case 0x04: case 0x05: case 0x06: case 0x07:
            time += (static_cast<uint32_t>(type) << 8) | *it++;
            flux_times.push_back(time * ps_per_tick / 1000);
            stream_pos += 2;
            time = 0;
            break;
        case 0xa:   // Nop3
            it++;
            stream_pos++;
        case 0x9:   // Nop2
            it++;
            stream_pos++;
        case 0x8:   // Nop1
            stream_pos++;
            break;
        case 0xb:   // Ovl16
            time += 0x10000;
            stream_pos++;
            break;

        case OOB:   // OOB
        {
            auto subtype = *it++;
            uint16_t size = *it++;
            size |= (*it++ << 8);

            switch (subtype)
            {
            case 0x00:  // Invalid
                warnings.push_back("invalid OOB detected");
                it = itEnd;
                break;

            case 0x01:  // StreamInfo
                assert(size == 8);
                break;

            case 0x02:  // Index
            {
                assert(size == 12);

                // Soft-sectored disks have a single start-of-track index.
                // Hard-sectors are combined to achieve the same result.
                if (opt.hardsectors <= 1 || !(++hard_indexes % opt.hardsectors))
                {
                    auto pdw = reinterpret_cast<const uint32_t*>(&*it);
                    index_offsets.push_back(util::letoh(pdw[0]));
                }
                break;
            }

            case 0x03:  // StreamEnd
            {
                assert(size == 8);

                auto pdw = reinterpret_cast<const uint32_t*>(&*it);
                //                      auto eof_pos = util::letoh(pdw[0]);
                auto eof_ret = util::letoh(pdw[1]);

                if (eof_ret == 1)
                    warnings.push_back("stream end (buffering problem)");
                else if (eof_ret == 2)
                    warnings.push_back("stream end (no index detected)");
                else if (eof_ret != 0)
                    warnings.push_back(util::fmt("stream end problem (%u)", eof_ret));
                break;
            }

            case 0x04:  // KFInfo
            {
                std::string info = reinterpret_cast<const char*>(&*it);
                for (auto& entry : util::split(info, ','))
                {
                    auto pos = entry.find('=');
                    if (pos != entry.npos)
                    {
                        auto name = util::trim(entry.substr(0, pos));
                        auto value = util::trim(entry.substr(pos + 1));

                        if (!name.empty() && !value.empty())
                        {
                            //                                  disk.metadata[name] = value;

                            if (name == "sck")
                                ps_per_tick = PS_PER_TICK(std::atoi(value.c_str()));
                        }
                    }
                }
                break;
            }

            case 0x0d:  // EOF
                assert(size == 0x0d0d);     // documented value
                size = 0;                   // size is fake, so clear it
                it = itEnd;                 // advance to end
                break;

            default:
                warnings.push_back(util::fmt("unexpected OOB sub-type (%X)", subtype));
                it = itEnd;
                break;
            }

            it += size;
            break;
        }

        default:    // Flux1
            time += type;
            flux_times.push_back(time * ps_per_tick / 1000);
            stream_pos++;
            time = 0;
            break;
        }
    }

    uint32_t last_pos = 0;
    for (auto index_offset : index_offsets)
    {
        // Ignore first partial track
        if (last_pos != 0)
        {
            // Find the most recent flux count.
            while (index_offset && !flux_counts[index_offset])
                --index_offset;

            // Extract flux segment for current revolution
            flux_revs.emplace_back(std::vector<uint32_t>(
                flux_times.begin() + last_pos,
                flux_times.begin() + flux_counts[index_offset]));
        }

        last_pos = flux_counts[index_offset];
    }

    if (flux_revs.size() == 0)
        warnings.push_back("no flux data");

    return flux_revs;
}